

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcheckbox.cpp
# Opt level: O0

int __thiscall QCheckBox::qt_metacall(QCheckBox *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  void **in_RDI;
  long in_FS_OFFSET;
  QObject *unaff_retaddr;
  QMetaType in_stack_fffffffffffffff0;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QAbstractButton::qt_metacall
                    ((QAbstractButton *)CONCAT44(in_ESI,in_EDX),(Call)((ulong)in_RCX >> 0x20),
                     (int)in_RCX,in_RDI);
  if (-1 < iVar1) {
    if (in_ESI == 0) {
      if (iVar1 < 2) {
        qt_static_metacall(unaff_retaddr,(Call)((ulong)lVar2 >> 0x20),(int)lVar2,
                           (void **)in_stack_fffffffffffffff0.d_ptr);
      }
      iVar1 = iVar1 + -2;
    }
    if (in_ESI == 7) {
      if (iVar1 < 2) {
        memset(&stack0xfffffffffffffff0,0,8);
        QMetaType::QMetaType((QMetaType *)&stack0xfffffffffffffff0);
        *(QMetaTypeInterface **)*in_RCX = in_stack_fffffffffffffff0.d_ptr;
      }
      iVar1 = iVar1 + -2;
    }
    if ((((in_ESI == 1) || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))) {
      qt_static_metacall(unaff_retaddr,(Call)((ulong)lVar2 >> 0x20),(int)lVar2,
                         (void **)in_stack_fffffffffffffff0.d_ptr);
      iVar1 = iVar1 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return iVar1;
}

Assistant:

int QCheckBox::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractButton::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    return _id;
}